

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_b_tree.cpp
# Opt level: O3

void __thiscall test_b_tree::test_insert_descending_order(test_b_tree *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  long lVar3;
  pointer plVar4;
  int64_t *__s;
  long lVar5;
  runtime_error *this_00;
  value_type_conflict1 *__val;
  pointer plVar6;
  undefined1 auVar7 [16];
  optional<long> oVar8;
  b_tree t;
  vector<long,_std::allocator<long>_> local_b0;
  string local_98;
  b_tree local_78;
  
  paVar1 = &local_78._p._fileName.field_2;
  local_78._p._fileName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"test_insert_descending_order.db","");
  b_tree::create_db_file((string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._p._fileName._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._p._fileName._M_dataplus._M_p,
                    local_78._p._fileName.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"test_insert_descending_order.db","");
  b_tree::b_tree(&local_78,&local_98,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  __s = (int64_t *)operator_new(800);
  local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = __s;
  local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 100;
  memset(__s,0,800);
  lVar5 = 0x62;
  auVar7 = _DAT_0010a170;
  do {
    lVar3 = auVar7._8_8_;
    auVar2._8_4_ = auVar7._0_4_;
    auVar2._0_8_ = lVar3;
    auVar2._12_4_ = auVar7._4_4_;
    *(undefined1 (*) [16])(__s + lVar5) = auVar2;
    auVar7._0_8_ = auVar7._0_8_ + 2;
    auVar7._8_8_ = lVar3 + 2;
    lVar5 = lVar5 + -2;
  } while (lVar5 != -2);
  local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = __s + 100;
  insert_all<b_tree>(&local_78,&local_b0);
  plVar4 = local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    plVar6 = local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      oVar8 = b_tree::search(&local_78,*plVar6);
      if (((undefined1  [16])
           oVar8.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        rtf_format_abi_cxx11_
                  (&local_98,"%s at Line:%d File:%s","has_all_keys(t, keys)",0xa2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
                  );
        std::runtime_error::runtime_error(this_00,(string *)&local_98);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      plVar6 = plVar6 + 1;
    } while (plVar6 != plVar4);
  }
  unlink("test_insert_descending_order.db");
  if (local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (int64_t *)0x0) {
    operator_delete(local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pager::~pager(&local_78._p);
  return;
}

Assistant:

void test_b_tree::test_large_number_of_keys()
{
    b_tree::create_db_file("test_large_number_of_keys.db");
    b_tree t("test_large_number_of_keys.db", 4);

    std::vector<int64_t> keys(10000);
    std::iota(begin(keys), end(keys), 1);
    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    insert_all(t, keys);

    RTF_ASSERT(has_all_keys(t, keys));

    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    for (auto k : keys) {
        t.remove(k);
    }

    for (auto k : keys) {
        RTF_ASSERT(!t.search(k));
    }

    unlink("test_large_number_of_keys.db");
}